

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expand.c
# Opt level: O0

int expand_pos_expression(dmr_C *C,expression *expr)

{
  int iVar1;
  int iVar2;
  undefined1 local_58 [8];
  ptr_list_iter entryiter__;
  expression *entry;
  expression *reuse;
  int nr;
  unsigned_long offset;
  expression *nested;
  expression *expr_local;
  dmr_C *C_local;
  
  entry = (expr->field_5).field_6.right;
  iVar2 = (expr->field_5).field_2.wide;
  offset = (unsigned_long)entry;
  if ((expr->field_5).field_15.idx_to == 1) {
    if (*(char *)entry == '\x18') {
      memcpy(expr,entry,0x40);
      ptrlist_forward_iterator((ptr_list_iter *)local_58,(ptr_list *)(expr->field_5).field_3.unop);
      entryiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_58);
      while (offset = (unsigned_long)expr, entryiter__._16_8_ != 0) {
        if ((*(ushort *)entryiter__._16_8_ & 0xff) == 0x1b) {
          *(int *)(entryiter__._16_8_ + 0x20) = *(int *)(entryiter__._16_8_ + 0x20) + iVar2;
        }
        else {
          if (entry == (expression *)0x0) {
            entry = dmrC_alloc_expression(C,*(position *)(entryiter__._16_8_ + 8),0x1b);
          }
          *(ushort *)entry = *(ushort *)entry & 0xff00 | 0x1b;
          entry->ctype = *(symbol **)(entryiter__._16_8_ + 0x10);
          (entry->field_5).field_2.wide = iVar2;
          (entry->field_5).field_15.idx_to = 1;
          (entry->field_5).field_2.string = (string *)entryiter__._16_8_;
          ptrlist_iter_set((ptr_list_iter *)local_58,entry);
          entry = (expression *)0x0;
        }
        entryiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_58);
      }
    }
    else if (*(char *)entry == '\x1b') {
      iVar1 = (entry->field_5).field_2.wide;
      memcpy(expr,entry,0x40);
      (expr->field_5).field_2.wide = iVar1 + iVar2;
      offset = (unsigned_long)expr;
    }
  }
  iVar2 = expand_expression(C,(expression *)offset);
  return iVar2;
}

Assistant:

static int expand_pos_expression(struct dmr_C *C, struct expression *expr)
{
	struct expression *nested = expr->init_expr;
	unsigned long offset = expr->init_offset;
	int nr = expr->init_nr;

	if (nr == 1) {
		switch (nested->type) {
		case EXPR_POS:
			offset += nested->init_offset;
			*expr = *nested;
			expr->init_offset = offset;
			nested = expr;
			break;

		case EXPR_INITIALIZER: {
			struct expression *reuse = nested, *entry;
			*expr = *nested;
			FOR_EACH_PTR(expr->expr_list, entry) {
				if (entry->type == EXPR_POS) {
					entry->init_offset += offset;
				} else {
					if (!reuse) {
						/*
						 * This happens rarely, but it can happen
						 * with bitfields that are all at offset
						 * zero..
						 */
						reuse = dmrC_alloc_expression(C, entry->pos, EXPR_POS);
					}
					reuse->type = EXPR_POS;
					reuse->ctype = entry->ctype;
					reuse->init_offset = offset;
					reuse->init_nr = 1;
					reuse->init_expr = entry;
					REPLACE_CURRENT_PTR(struct expression *, entry, reuse);
					reuse = NULL;
				}
			} END_FOR_EACH_PTR(entry);
			nested = expr;
			break;
		}

		default:
			break;
		}
	}
	return expand_expression(C, nested);
}